

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O2

void Curl_multi_closed(connectdata *conn,curl_socket_t s)

{
  Curl_multi *pCVar1;
  Curl_sh_entry *pCVar2;
  
  if ((conn->data != (Curl_easy *)0x0) && (pCVar1 = conn->data->multi, pCVar1 != (Curl_multi *)0x0))
  {
    pCVar2 = sh_getentry(&pCVar1->sockhash,s);
    if (pCVar2 != (Curl_sh_entry *)0x0) {
      if (pCVar1->socket_cb != (curl_socket_callback)0x0) {
        (*pCVar1->socket_cb)(conn->data,s,4,pCVar1->socket_userp,pCVar2->socketp);
      }
      sh_delentry(&pCVar1->sockhash,s);
      return;
    }
  }
  return;
}

Assistant:

void Curl_multi_closed(struct connectdata *conn, curl_socket_t s)
{
  if(conn->data) {
    /* if there's still an easy handle associated with this connection */
    struct Curl_multi *multi = conn->data->multi;
    if(multi) {
      /* this is set if this connection is part of a handle that is added to
         a multi handle, and only then this is necessary */
      struct Curl_sh_entry *entry = sh_getentry(&multi->sockhash, s);

      if(entry) {
        if(multi->socket_cb)
          multi->socket_cb(conn->data, s, CURL_POLL_REMOVE,
                           multi->socket_userp,
                           entry->socketp);

        /* now remove it from the socket hash */
        sh_delentry(&multi->sockhash, s);
      }
    }
  }
}